

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pagerUnlockAndRollback(Pager *pPager)

{
  Pager *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  undefined4 in_stack_00000008;
  u8 eLock;
  int errCode;
  undefined4 in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  
  if ((in_RDI->eState == '\x06') || (in_RDI->eState == '\0')) {
    if ((in_RDI->eState == '\x06') &&
       ((in_RDI->journalMode == '\x04' && (in_RDI->jfd->pMethods != (sqlite3_io_methods *)0x0)))) {
      in_stack_fffffffffffffff4 = in_RDI->errCode;
      in_stack_fffffffffffffff0 = CONCAT13(in_RDI->eLock,(int3)in_stack_fffffffffffffff0);
      in_RDI->eState = '\0';
      in_RDI->errCode = 0;
      in_RDI->eLock = '\x04';
      pager_playback(pPager,errCode);
      in_RDI->errCode = in_stack_fffffffffffffff4;
      in_RDI->eLock = (u8)((uint)in_stack_fffffffffffffff0 >> 0x18);
    }
  }
  else if (in_RDI->eState < 2) {
    if (in_RDI->exclusiveMode == '\0') {
      pager_end_transaction
                ((Pager *)CONCAT44(errCode,in_stack_00000008),unaff_retaddr_00,unaff_retaddr);
    }
  }
  else {
    sqlite3BeginBenignMalloc();
    sqlite3PagerRollback(in_RDI);
    sqlite3EndBenignMalloc();
  }
  pager_unlock((Pager *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  return;
}

Assistant:

static void pagerUnlockAndRollback(Pager *pPager){
  if( pPager->eState!=PAGER_ERROR && pPager->eState!=PAGER_OPEN ){
    assert( assert_pager_state(pPager) );
    if( pPager->eState>=PAGER_WRITER_LOCKED ){
      sqlite3BeginBenignMalloc();
      sqlite3PagerRollback(pPager);
      sqlite3EndBenignMalloc();
    }else if( !pPager->exclusiveMode ){
      assert( pPager->eState==PAGER_READER );
      pager_end_transaction(pPager, 0, 0);
    }
  }else if( pPager->eState==PAGER_ERROR
         && pPager->journalMode==PAGER_JOURNALMODE_MEMORY
         && isOpen(pPager->jfd)
  ){
    /* Special case for a ROLLBACK due to I/O error with an in-memory
    ** journal:  We have to rollback immediately, before the journal is
    ** closed, because once it is closed, all content is forgotten. */
    int errCode = pPager->errCode;
    u8 eLock = pPager->eLock;
    pPager->eState = PAGER_OPEN;
    pPager->errCode = SQLITE_OK;
    pPager->eLock = EXCLUSIVE_LOCK;
    pager_playback(pPager, 1);
    pPager->errCode = errCode;
    pPager->eLock = eLock;
  }
  pager_unlock(pPager);
}